

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

int getaddrinfo_complete(connectdata *conn)

{
  CURLcode CVar1;
  thread_sync_data *ptVar2;
  int rc;
  thread_sync_data *tsd;
  connectdata *conn_local;
  
  ptVar2 = conn_thread_sync_data(conn);
  CVar1 = Curl_addrinfo_callback(conn,ptVar2->sock_error,ptVar2->res);
  ptVar2->res = (Curl_addrinfo *)0x0;
  return CVar1;
}

Assistant:

static int getaddrinfo_complete(struct connectdata *conn)
{
  struct thread_sync_data *tsd = conn_thread_sync_data(conn);
  int rc;

  rc = Curl_addrinfo_callback(conn, tsd->sock_error, tsd->res);
  /* The tsd->res structure has been copied to async.dns and perhaps the DNS
     cache.  Set our copy to NULL so destroy_thread_sync_data doesn't free it.
  */
  tsd->res = NULL;

  return rc;
}